

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt_string.c
# Opt level: O0

dropt_char * dropt_strndup(dropt_char *s,size_t n)

{
  bool bVar1;
  ulong local_30;
  size_t len;
  dropt_char *copy;
  size_t n_local;
  dropt_char *s_local;
  
  local_30 = 0;
  if (s == (dropt_char *)0x0) {
    __assert_fail("s != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt_string.c"
                  ,0xcb,"dropt_char *dropt_strndup(const dropt_char *, size_t)");
  }
  while( true ) {
    bVar1 = false;
    if (local_30 < n) {
      bVar1 = s[local_30] != '\0';
    }
    if (!bVar1) break;
    local_30 = local_30 + 1;
  }
  if (local_30 + 1 < local_30) {
    s_local = (dropt_char *)0x0;
  }
  else {
    s_local = (dropt_char *)dropt_safe_malloc(local_30 + 1,1);
    if (s_local != (dropt_char *)0x0) {
      memcpy(s_local,s,local_30);
      s_local[local_30] = '\0';
    }
  }
  return s_local;
}

Assistant:

dropt_char*
dropt_strndup(const dropt_char* s, size_t n)
{
    dropt_char* copy;
    size_t len = 0;

    assert(s != NULL);

    while (len < n && s[len] != DROPT_TEXT_LITERAL('\0'))
    {
        len++;
    }

    if (len + 1 < len)
    {
        /* This overflow check shouldn't be strictly necessary. `len` can be at
         * most `SIZE_MAX`, so `SIZE_MAX + 1` can wrap around to 0, but
         * `dropt_safe_malloc` will return `NULL` for a 0-sized allocation.
         * However, favor defensive paranoia.
         */
        return NULL;
    }

    copy = dropt_safe_malloc(len + 1 /* NUL */, sizeof *copy);
    if (copy != NULL)
    {
        memcpy(copy, s, len * sizeof *copy);
        copy[len] = DROPT_TEXT_LITERAL('\0');
    }

    return copy;
}